

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QPointF __thiscall QGraphicsViewPrivate::mapToScene(QGraphicsViewPrivate *this,QPointF *point)

{
  QPointF QVar1;
  qint64 qVar2;
  qreal *pqVar3;
  qreal *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qreal in_XMM1_Qa;
  QPointF p;
  QGraphicsViewPrivate *in_stack_ffffffffffffff50;
  QPointF local_78;
  qreal local_68;
  qreal local_60;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.xp = *in_RSI;
  local_78.yp = in_RSI[1];
  qVar2 = horizontalScroll(in_stack_ffffffffffffff50);
  pqVar3 = QPointF::rx(&local_78);
  *pqVar3 = (double)qVar2 + *pqVar3;
  qVar2 = verticalScroll(in_stack_ffffffffffffff50);
  pqVar3 = QPointF::ry(&local_78);
  *pqVar3 = (double)qVar2 + *pqVar3;
  if ((*(uint *)(in_RDI + 0x300) >> 4 & 1) == 0) {
    QTransform::inverted((bool *)local_58);
    local_68 = (qreal)QTransform::map((QPointF *)local_58);
    local_60 = in_XMM1_Qa;
  }
  else {
    local_68 = local_78.xp;
    local_60 = local_78.yp;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.yp = local_60;
    QVar1.xp = local_68;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsViewPrivate::mapToScene(const QPointF &point) const
{
    QPointF p = point;
    p.rx() += horizontalScroll();
    p.ry() += verticalScroll();
    return identityMatrix ? p : matrix.inverted().map(p);
}